

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O0

bool __thiscall
Diligent::FramebufferCache::FramebufferCacheKey::UsesImageView
          (FramebufferCacheKey *this,VkImageView View)

{
  bool local_31;
  uint local_24;
  Uint32 rt;
  VkImageView View_local;
  FramebufferCacheKey *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->NumRenderTargets <= local_24) {
      local_31 = true;
      if (this->DSV != View) {
        local_31 = this->ShadingRate == View;
      }
      return local_31;
    }
    if (this->RTVs[local_24] == View) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool FramebufferCache::FramebufferCacheKey::UsesImageView(VkImageView View) const
{
    for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
    {
        if (RTVs[rt] == View)
            return true;
    }
    return DSV == View || ShadingRate == View;
}